

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool CoreML::Specification::BoxCoordinatesMode_Coordinates_IsValid(int value)

{
  int value_local;
  
  return (uint)value < 4;
}

Assistant:

bool BoxCoordinatesMode_Coordinates_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
    case 3:
      return true;
    default:
      return false;
  }
}